

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O2

ClauseIterator __thiscall
Indexing::SubstitutionTreeClauseVariantIndex::retrieveVariants
          (SubstitutionTreeClauseVariantIndex *this,Literal **lits,uint length)

{
  LiteralSubstitutionTree<Indexing::LiteralClause> *query;
  bool bVar1;
  LiteralSubstitutionTree<Indexing::LiteralClause> **ppLVar2;
  Literal *pLVar3;
  _func_int **pp_Var4;
  uint in_ECX;
  undefined4 in_register_00000014;
  Literal **key;
  SubstitutionTreeClauseVariantIndex *this_00;
  undefined1 local_138 [16];
  ClauseList *lst;
  ResultClauseToVariantClauseFn local_e0;
  MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>,_Kernel::Clause_*>
  local_c0;
  ResultClauseToVariantClauseFn local_90;
  FilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  local_68;
  
  key = (Literal **)CONCAT44(in_register_00000014,length);
  if (in_ECX == 1) {
    bVar1 = Kernel::Term::ground(&(*key)->super_Term);
    if (bVar1) {
      bVar1 = Lib::
              DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::find((DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                      *)(lits + 1),key,&lst);
      if (bVar1) goto LAB_0026dee5;
      goto LAB_0026e0aa;
    }
  }
  else if (in_ECX == 0) {
    lst = (ClauseList *)lits[9];
LAB_0026dee5:
    Lib::pvi<Lib::List<Kernel::Clause*>::Iterator>((Lib *)this,(Iterator)lst);
    return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
  }
  this_00 = (SubstitutionTreeClauseVariantIndex *)(lits + 6);
  ppLVar2 = Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::operator[]
                      ((Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*> *)
                       this_00,(ulong)in_ECX);
  query = *ppLVar2;
  if (query != (LiteralSubstitutionTree<Indexing::LiteralClause> *)0x0) {
    pLVar3 = getMainLiteral(this_00,key,in_ECX);
    LiteralSubstitutionTree<Indexing::LiteralClause>::getVariants
              ((LiteralSubstitutionTree<Indexing::LiteralClause> *)local_138,(Literal *)query,
               SUB81(pLVar3,0),false);
    ClauseVariantIndex::ResultClauseToVariantClauseFn::ResultClauseToVariantClauseFn
              (&local_e0,key,in_ECX);
    ClauseVariantIndex::ResultClauseToVariantClauseFn::ResultClauseToVariantClauseFn
              ((ResultClauseToVariantClauseFn *)&lst,&local_e0);
    ClauseVariantIndex::ResultClauseToVariantClauseFn::ResultClauseToVariantClauseFn
              (&local_90,(ResultClauseToVariantClauseFn *)&lst);
    Lib::SmartPtr<Indexing::LiteralMiniIndex>::~SmartPtr
              ((SmartPtr<Indexing::LiteralMiniIndex> *)&stack0xfffffffffffffee8);
    local_138._8_8_ = local_138._0_8_;
    if ((IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
         *)local_138._0_8_ !=
        (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
         *)0x0) {
      *(int *)(local_138._0_8_ + 8) = *(int *)(local_138._0_8_ + 8) + 1;
    }
    ClauseVariantIndex::ResultClauseToVariantClauseFn::ResultClauseToVariantClauseFn
              ((ResultClauseToVariantClauseFn *)&lst,&local_90);
    ClauseVariantIndex::ResultClauseToVariantClauseFn::ResultClauseToVariantClauseFn
              ((ResultClauseToVariantClauseFn *)&local_c0,(ResultClauseToVariantClauseFn *)&lst);
    local_c0._inner._core =
         (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
          *)local_138._8_8_;
    if ((IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
         *)local_138._8_8_ !=
        (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
         *)0x0) {
      *(int *)(local_138._8_8_ + 8) = *(int *)(local_138._8_8_ + 8) + 1;
    }
    Lib::SmartPtr<Indexing::LiteralMiniIndex>::~SmartPtr
              ((SmartPtr<Indexing::LiteralMiniIndex> *)&stack0xfffffffffffffee8);
    Lib::
    VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
    ::~VirtualIterator((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                        *)(local_138 + 8));
    Lib::
    MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/ClauseVariantIndex.cpp:132:68)>,_Kernel::Clause_*>
    ::MappingIterator((MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>,_Kernel::Clause_*>
                       *)&lst,&local_c0);
    Lib::
    MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/ClauseVariantIndex.cpp:132:68)>,_Kernel::Clause_*>
    ::MappingIterator(&local_68._inn,
                      (MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>,_Kernel::Clause_*>
                       *)&lst);
    local_68._next.super_OptionBase<Kernel::Clause_*>._isSome = false;
    local_68._next.super_OptionBase<Kernel::Clause_*>._1_7_ = 0;
    local_68._next.super_OptionBase<Kernel::Clause_*>._elem._elem.init = (Value)0x0;
    Lib::
    MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/ClauseVariantIndex.cpp:132:68)>,_Kernel::Clause_*>
    ::~MappingIterator((MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>,_Kernel::Clause_*>
                        *)&lst);
    pp_Var4 = (_func_int **)Lib::alloc(0x58,8);
    Lib::
    FilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/ClauseVariantIndex.cpp:132:68)>,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
    ::FilteredIterator((FilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
                        *)&lst,&local_68);
    *(undefined4 *)(pp_Var4 + 1) = 0;
    *pp_Var4 = (_func_int *)&PTR__ProxyIterator_009ea1f0;
    Lib::
    FilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/ClauseVariantIndex.cpp:132:68)>,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
    ::FilteredIterator((FilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
                        *)(pp_Var4 + 2),
                       (FilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
                        *)&lst);
    (this->super_ClauseVariantIndex)._vptr_ClauseVariantIndex = pp_Var4;
    *(int *)(pp_Var4 + 1) = *(int *)(pp_Var4 + 1) + 1;
    Lib::
    MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/ClauseVariantIndex.cpp:132:68)>,_Kernel::Clause_*>
    ::~MappingIterator((MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>,_Kernel::Clause_*>
                        *)&stack0xfffffffffffffee0);
    Lib::
    MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/ClauseVariantIndex.cpp:132:68)>,_Kernel::Clause_*>
    ::~MappingIterator(&local_68._inn);
    Lib::
    MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/ClauseVariantIndex.cpp:132:68)>,_Kernel::Clause_*>
    ::~MappingIterator(&local_c0);
    Lib::SmartPtr<Indexing::LiteralMiniIndex>::~SmartPtr(&local_90._queryIndex);
    Lib::SmartPtr<Indexing::LiteralMiniIndex>::~SmartPtr(&local_e0._queryIndex);
    Lib::
    VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
    ::~VirtualIterator((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                        *)local_138);
    return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
  }
LAB_0026e0aa:
  Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

ClauseIterator SubstitutionTreeClauseVariantIndex::retrieveVariants(Literal* const * lits, unsigned length)
{
  if(length==0) {
    return pvi( ClauseList::Iterator(_emptyClauses) );
  }
  if(length==1 && lits[0]->ground()) {
    ClauseList* lst;
    if(_groundUnits.find(lits[0], lst)) {
      ASS(lst);
      return pvi( ClauseList::Iterator(lst) );
    }
    else {
      return ClauseIterator::getEmpty();
    }
  }

  LiteralSubstitutionTree* index=_strees[length];
  if(!index) {
    return ClauseIterator::getEmpty();
  }

  Literal* mainLit=getMainLiteral(lits, length);
  return pvi( getFilteredIterator(
    getMappingIterator(
      index->getVariants(mainLit, false, false),
      getCompositionFn(ResultClauseToVariantClauseFn(lits, length),[](auto qr) { return qr.data->clause; })),
    NonzeroFn()) );
}